

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

int Dar2_LibCutMatch(Gia_Man_t *p,Vec_Int_t *vCutLits,uint uTruth)

{
  char cVar1;
  char *pcVar2;
  Dar_Lib_t *pDVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  long lVar7;
  
  if (vCutLits->nSize == 4) {
    cVar1 = s_DarLib->pPhases[uTruth];
    pcVar2 = s_DarLib->pPerms4[s_DarLib->pPerms[uTruth]];
    iVar4 = 4;
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < iVar4; lVar7 = lVar7 + 1) {
      iVar4 = Vec_IntEntry(vCutLits,(int)pcVar2[lVar7]);
      iVar4 = Abc_LitNotCond(iVar4,(uint)(((uint)(int)cVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0));
      pDVar3 = s_DarLib;
      *(int *)(s_DarLib->pDatas->nLats + lVar6 + -0x15) = iVar4;
      pGVar5 = Gia_ObjFromLit(p,*(int *)(pDVar3->pDatas->nLats + lVar6 + -0x15));
      iVar4 = Gia_ObjLevel(p,(Gia_Obj_t *)((ulong)pGVar5 & 0xfffffffffffffffe));
      *(int *)(s_DarLib->pDatas->nLats + lVar6 + -0xd) = iVar4;
      iVar4 = vCutLits->nSize;
      lVar6 = lVar6 + 0x18;
    }
    return 1;
  }
  __assert_fail("Vec_IntSize(vCutLits) == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                ,0x425,"int Dar2_LibCutMatch(Gia_Man_t *, Vec_Int_t *, unsigned int)");
}

Assistant:

int Dar2_LibCutMatch( Gia_Man_t * p, Vec_Int_t * vCutLits, unsigned uTruth )
{
    unsigned uPhase;
    char * pPerm;
    int i;
    assert( Vec_IntSize(vCutLits) == 4 );
    // get the fanin permutation
    uPhase = s_DarLib->pPhases[uTruth];
    pPerm  = s_DarLib->pPerms4[ (int)s_DarLib->pPerms[uTruth] ];
    // collect fanins with the corresponding permutation/phase
    for ( i = 0; i < Vec_IntSize(vCutLits); i++ )
    {
//        pFanin = Gia_ManObj( p, pCut->pLeaves[ (int)pPerm[i] ] );
//        pFanin = Gia_ManObj( p, Vec_IntEntry( vCutLits, (int)pPerm[i] ) );
//        pFanin = Gia_ObjFromLit( p, Vec_IntEntry( vCutLits, (int)pPerm[i] ) );
        s_DarLib->pDatas[i].iGunc = Abc_LitNotCond( Vec_IntEntry(vCutLits, (int)pPerm[i]), ((uPhase >> i) & 1) );
        s_DarLib->pDatas[i].Level = Gia_ObjLevel( p, Gia_Regular(Gia_ObjFromLit(p, s_DarLib->pDatas[i].iGunc)) );
    }
    return 1;
}